

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeSorterRowkey(VdbeCursor *pCsr,Mem *pOut)

{
  undefined2 uVar1;
  int iVar2;
  VdbeSorter *pVVar3;
  u8 *__src;
  int iVar4;
  int iVar5;
  SorterRecord *pSVar6;
  u8 **ppuVar7;
  
  pVVar3 = pCsr->pSorter;
  if (pVVar3->aTree == (int *)0x0) {
    pSVar6 = pVVar3->pRecord;
    ppuVar7 = (u8 **)&pSVar6->nVal;
  }
  else {
    iVar2 = pVVar3->aTree[1];
    ppuVar7 = (u8 **)&pVVar3->aIter[iVar2].nKey;
    pSVar6 = (SorterRecord *)&pVVar3->aIter[iVar2].aKey;
  }
  iVar2 = *(int *)ppuVar7;
  __src = (u8 *)pSVar6->pVal;
  iVar4 = sqlite3VdbeMemGrow(pOut,iVar2,0);
  iVar5 = 7;
  if (iVar4 == 0) {
    pOut->n = iVar2;
    uVar1 = pOut->flags;
    pOut->flags = uVar1 & 0xbe00 | 0x10;
    memcpy(pOut->z,__src,(long)iVar2);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeSorterRowkey(const VdbeCursor *pCsr, Mem *pOut){
  VdbeSorter *pSorter = pCsr->pSorter;
  void *pKey; int nKey;           /* Sorter key to copy into pOut */

  pKey = vdbeSorterRowkey(pSorter, &nKey);
  if( sqlite3VdbeMemGrow(pOut, nKey, 0) ){
    return SQLITE_NOMEM;
  }
  pOut->n = nKey;
  MemSetTypeFlag(pOut, MEM_Blob);
  memcpy(pOut->z, pKey, nKey);

  return SQLITE_OK;
}